

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_NurbsSurface::SetCV(ON_NurbsSurface *this,int i,int j,ON_4dPoint *point)

{
  double *pdVar1;
  double local_38;
  double w;
  double *cv;
  bool rc;
  ON_4dPoint *point_local;
  int j_local;
  int i_local;
  ON_NurbsSurface *this_local;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  cv._7_1_ = false;
  pdVar1 = CV(this,i,j);
  if (pdVar1 != (double *)0x0) {
    if (this->m_is_rat == 0) {
      if ((point->w != 0.0) || (NAN(point->w))) {
        local_38 = 1.0 / point->w;
        cv._7_1_ = true;
      }
      else {
        local_38 = 1.0;
      }
      *pdVar1 = local_38 * point->x;
      if ((1 < this->m_dim) && (pdVar1[1] = local_38 * point->y, 2 < this->m_dim)) {
        pdVar1[2] = local_38 * point->z;
      }
    }
    else {
      *pdVar1 = point->x;
      if ((1 < this->m_dim) && (pdVar1[1] = point->y, 2 < this->m_dim)) {
        pdVar1[2] = point->z;
      }
      pdVar1[this->m_dim] = point->w;
      cv._7_1_ = true;
    }
  }
  return cv._7_1_;
}

Assistant:

bool 
ON_NurbsSurface::SetCV( int i, int j, const ON_4dPoint& point )
{
  DestroySurfaceTree();

  bool rc = false;
  double* cv = CV(i,j);
  if ( cv ) {
    if ( m_is_rat ) {
      cv[0] = point.x;
      if ( m_dim > 1 ) {
        cv[1] = point.y;
        if ( m_dim > 2 )
          cv[2] = point.z;
      }
      cv[m_dim] = point.w;
      rc = true;
    }
    else {
      double w;
      if ( point.w != 0.0 ) {
        w = 1.0/point.w;
        rc = true;
      }
      else {
        w = 1.0;
      }
      cv[0] = w*point.x;
      if ( m_dim > 1 ) {
        cv[1] = w*point.y;
        if ( m_dim > 2 ) {
          cv[2] = w*point.z;
        }
      }
    }
  }
  return rc;
}